

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selfguided_avx2.c
# Opt level: O0

void * memset_zero_avx(int32_t *dest,__m256i *zero,size_t count)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 *puVar4;
  ulong in_RDX;
  undefined8 *in_RSI;
  void *in_RDI;
  uint i;
  uint local_17c;
  
  for (local_17c = 0; (ulong)local_17c < (in_RDX & 0xffffffe0); local_17c = local_17c + 0x20) {
    puVar4 = (undefined8 *)((long)in_RDI + (ulong)local_17c * 4);
    uVar1 = in_RSI[1];
    uVar2 = in_RSI[2];
    uVar3 = in_RSI[3];
    *puVar4 = *in_RSI;
    puVar4[1] = uVar1;
    puVar4[2] = uVar2;
    puVar4[3] = uVar3;
    uVar1 = in_RSI[1];
    uVar2 = in_RSI[2];
    uVar3 = in_RSI[3];
    *(undefined8 *)((long)in_RDI + (ulong)local_17c * 4 + 0x20) = *in_RSI;
    *(undefined8 *)((long)in_RDI + (ulong)local_17c * 4 + 0x28) = uVar1;
    *(undefined8 *)((long)in_RDI + (ulong)local_17c * 4 + 0x30) = uVar2;
    *(undefined8 *)((long)in_RDI + (ulong)local_17c * 4 + 0x38) = uVar3;
    uVar1 = in_RSI[1];
    uVar2 = in_RSI[2];
    uVar3 = in_RSI[3];
    *(undefined8 *)((long)in_RDI + (ulong)local_17c * 4 + 0x40) = *in_RSI;
    *(undefined8 *)((long)in_RDI + (ulong)local_17c * 4 + 0x48) = uVar1;
    *(undefined8 *)((long)in_RDI + (ulong)local_17c * 4 + 0x50) = uVar2;
    *(undefined8 *)((long)in_RDI + (ulong)local_17c * 4 + 0x58) = uVar3;
    uVar1 = in_RSI[1];
    uVar2 = in_RSI[2];
    uVar3 = in_RSI[3];
    *(undefined8 *)((long)in_RDI + (ulong)local_17c * 4 + 0x60) = *in_RSI;
    *(undefined8 *)((long)in_RDI + (ulong)local_17c * 4 + 0x68) = uVar1;
    *(undefined8 *)((long)in_RDI + (ulong)local_17c * 4 + 0x70) = uVar2;
    *(undefined8 *)((long)in_RDI + (ulong)local_17c * 4 + 0x78) = uVar3;
  }
  for (; (ulong)local_17c < (in_RDX & 0xfffffff8); local_17c = local_17c + 8) {
    puVar4 = (undefined8 *)((long)in_RDI + (ulong)local_17c * 4);
    uVar1 = in_RSI[1];
    uVar2 = in_RSI[2];
    uVar3 = in_RSI[3];
    *puVar4 = *in_RSI;
    puVar4[1] = uVar1;
    puVar4[2] = uVar2;
    puVar4[3] = uVar3;
  }
  for (; local_17c < in_RDX; local_17c = local_17c + 1) {
    *(undefined4 *)((long)in_RDI + (ulong)local_17c * 4) = 0;
  }
  return in_RDI;
}

Assistant:

static void *memset_zero_avx(int32_t *dest, const __m256i *zero, size_t count) {
  unsigned int i = 0;
  for (i = 0; i < (count & 0xffffffe0); i += 32) {
    _mm256_storeu_si256((__m256i *)(dest + i), *zero);
    _mm256_storeu_si256((__m256i *)(dest + i + 8), *zero);
    _mm256_storeu_si256((__m256i *)(dest + i + 16), *zero);
    _mm256_storeu_si256((__m256i *)(dest + i + 24), *zero);
  }
  for (; i < (count & 0xfffffff8); i += 8) {
    _mm256_storeu_si256((__m256i *)(dest + i), *zero);
  }
  for (; i < count; i++) {
    dest[i] = 0;
  }
  return dest;
}